

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

size_t __thiscall jessilib::thread_pool::active(thread_pool *this)

{
  pointer ptVar1;
  pointer ptVar2;
  size_type sVar3;
  
  std::mutex::lock(&this->m_inactive_threads_mutex);
  ptVar1 = (this->m_threads).
           super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ptVar2 = (this->m_threads).
           super__Vector_base<jessilib::thread_pool::thread,_std::allocator<jessilib::thread_pool::thread>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = std::
          deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>::
          size(&(this->m_inactive_threads).c);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_inactive_threads_mutex);
  return ((long)ptVar1 - (long)ptVar2) / 0x88 - sVar3;
}

Assistant:

size_t thread_pool::active() const {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);
	return threads() - m_inactive_threads.size();
}